

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

unsigned_long_long ZSTD_decompressBound(void *src,size_t srcSize)

{
  unsigned_long_long uVar1;
  bool bVar2;
  bool bVar3;
  ZSTD_frameSizeInfo ZVar4;
  
  uVar1 = 0;
  do {
    if (srcSize == 0) {
      return uVar1;
    }
    ZVar4 = ZSTD_findFrameSizeInfo(src,srcSize);
    bVar2 = ZVar4.compressedSize < 0xffffffffffffff89;
    bVar3 = ZVar4.decompressedBound != 0xfffffffffffffffe;
    if (!bVar2 || !bVar3) {
      ZVar4 = (ZSTD_frameSizeInfo)ZEXT816(0);
    }
    uVar1 = uVar1 + ZVar4.decompressedBound;
    srcSize = srcSize - ZVar4.compressedSize;
    src = (void *)((long)src + ZVar4.compressedSize);
  } while (bVar2 && bVar3);
  return 0xfffffffffffffffe;
}

Assistant:

unsigned long long ZSTD_decompressBound(const void* src, size_t srcSize)
{
    unsigned long long bound = 0;
    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ZSTD_CONTENTSIZE_ERROR;
        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
        bound += decompressedBound;
    }
    return bound;
}